

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.h
# Opt level: O3

double __thiscall soplex::SPxSolverBase<double>::delta(SPxSolverBase<double> *this)

{
  Tolerances *this_00;
  Real RVar1;
  Real RVar2;
  
  RVar1 = Tolerances::floatingPointFeastol
                    ((this->super_SPxLPBase<double>)._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  RVar2 = Tolerances::floatingPointOpttol
                    ((this->super_SPxLPBase<double>)._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  this_00 = (this->super_SPxLPBase<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (RVar2 < RVar1) {
    RVar1 = Tolerances::floatingPointFeastol(this_00);
    return RVar1;
  }
  RVar1 = Tolerances::floatingPointOpttol(this_00);
  return RVar1;
}

Assistant:

R delta() const
   {
      return SOPLEX_MAX(this->tolerances()->floatingPointFeastol(),
                        this->tolerances()->floatingPointOpttol());
   }